

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

int mu_check_clip(mu_Context *ctx,mu_Rect r)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  mu_Rect mVar10;
  
  mVar10 = mu_get_clip_rect(ctx);
  iVar1 = mVar10.x;
  iVar5 = mVar10.w + iVar1;
  uVar2 = 2;
  iVar9 = r.x;
  if (iVar9 <= iVar5) {
    iVar6 = r.w + iVar9;
    if (iVar1 <= iVar6) {
      iVar8 = mVar10.y;
      iVar3 = mVar10.h + iVar8;
      iVar7 = r.y;
      if ((iVar7 <= iVar3) && (iVar4 = r.h + iVar7, iVar8 <= iVar4)) {
        uVar2 = (uint)(iVar3 < iVar4 || ((iVar7 < iVar8 || iVar9 < iVar1) || iVar5 < iVar6));
      }
    }
  }
  return uVar2;
}

Assistant:

int mu_check_clip(mu_Context *ctx, mu_Rect r) {
  mu_Rect cr = mu_get_clip_rect(ctx);
  if (r.x > cr.x + cr.w || r.x + r.w < cr.x ||
      r.y > cr.y + cr.h || r.y + r.h < cr.y   ) { return MU_CLIP_ALL; }
  if (r.x >= cr.x && r.x + r.w <= cr.x + cr.w &&
      r.y >= cr.y && r.y + r.h <= cr.y + cr.h ) { return 0; }
  return MU_CLIP_PART;
}